

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

ident * writeident(char *name,int flags)

{
  uint uVar1;
  ident *id;
  
  id = newident(name,flags);
  uVar1 = id->index;
  if (((long)(int)uVar1 < 0x19) && (((uint)aliasstack->usedargs >> (uVar1 & 0x1f) & 1) == 0)) {
    pusharg(id,&nullval.super_tagval,aliasstack->argstack + (int)uVar1);
    aliasstack->usedargs = aliasstack->usedargs | 1 << ((byte)id->index & 0x1f);
  }
  return id;
}

Assistant:

ident *writeident(const char *name, int flags)
{
    ident *id = newident(name, flags);
    if(id->index < MAXARGS && !(aliasstack->usedargs&(1<<id->index)))
    {
        pusharg(*id, nullval, aliasstack->argstack[id->index]);
        aliasstack->usedargs |= 1<<id->index;
    }
    return id;
}